

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetImportedLibName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  ImportInfo *pIVar1;
  ImportInfo *info;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  pIVar1 = GetImportInfo(this,config);
  if (pIVar1 == (ImportInfo *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pIVar1->LibName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetImportedLibName(
  std::string const& config) const
{
  if (cmGeneratorTarget::ImportInfo const* info =
        this->GetImportInfo(config)) {
    return info->LibName;
  }
  return std::string();
}